

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_gentm.cc
# Opt level: O3

int asn1_generalizedtime_to_tm(tm *tm,ASN1_GENERALIZEDTIME *d)

{
  uint uVar1;
  int iVar2;
  CBS cbs;
  CBS local_10;
  
  uVar1 = 0;
  if (d->type == 0x18) {
    local_10.data = d->data;
    local_10.len = (size_t)d->length;
    iVar2 = CBS_parse_generalized_time(&local_10,tm,0);
    uVar1 = (uint)(iVar2 != 0);
  }
  return uVar1;
}

Assistant:

int asn1_generalizedtime_to_tm(struct tm *tm, const ASN1_GENERALIZEDTIME *d) {
  if (d->type != V_ASN1_GENERALIZEDTIME) {
    return 0;
  }
  CBS cbs;
  CBS_init(&cbs, d->data, (size_t)d->length);
  if (!CBS_parse_generalized_time(&cbs, tm, /*allow_timezone_offset=*/0)) {
    return 0;
  }
  return 1;
}